

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_out(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fsm *in_RDI;
  nn_sockbase *unaff_retaddr;
  nn_req *req;
  int in_stack_ffffffffffffffdc;
  nn_fsm *pnVar1;
  nn_fsm *self_00;
  
  pnVar1 = in_RDI;
  if (in_RDI == (nn_fsm *)0x0) {
    pnVar1 = (nn_fsm *)0x0;
  }
  self_00 = pnVar1;
  nn_xreq_out(unaff_retaddr,(nn_pipe *)in_RDI);
  if (*(int *)&pnVar1[10].shutdown_fn == 3) {
    nn_fsm_action(self_00,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void nn_req_out (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Add the pipe to the underlying raw socket. */
    nn_xreq_out (&req->xreq.sockbase, pipe);

    /*  Notify the state machine. */
    if (req->state == NN_REQ_STATE_DELAYED)
        nn_fsm_action (&req->fsm, NN_REQ_ACTION_OUT);
}